

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::Formatter::Set<char[14]>
          (Formatter *this,string *key,char (*value) [14])

{
  mapped_type *this_00;
  allocator local_61;
  string local_60;
  string local_40;
  char (*local_20) [14];
  char (*value_local) [14];
  string *key_local;
  Formatter *this_local;
  
  local_20 = value;
  value_local = (char (*) [14])key;
  key_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,*value,&local_61);
  ToString(&local_40,&local_60);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->vars_,(key_type *)value_local);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  return;
}

Assistant:

void Set(const std::string& key, const T& value) {
    vars_[key] = ToString(value);
  }